

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_api_loader.cpp
# Opt level: O2

void lua_rawsetp(lua_State *L,int idx,void *p)

{
  int iVar1;
  
  if ((luaVersion & 0xfffffffe) == LUA_JIT) {
    if (idx < 0) {
      iVar1 = (*lua_gettop)(L);
      idx = idx + iVar1 + 1;
    }
    (*lua_pushlightuserdata)(L,p);
    lua_insert(L,-2);
    (*lua_rawset)(L,idx);
    return;
  }
  (*e_lua_rawsetp)(L,idx,p);
  return;
}

Assistant:

void lua_rawsetp(lua_State* L, int idx, const void* p)
{
	if (luaVersion == LuaVersion::LUA_51 || luaVersion == LuaVersion::LUA_JIT)
	{
		if (idx < 0)
		{
			idx += lua_gettop(L) + 1;
		}
		lua_pushlightuserdata(L, (void*)p);
		lua_insert(L, -2);
		lua_rawset(L, idx);
	}
	else
	{
		return e_lua_rawsetp(L, idx, p);
	}
}